

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O1

FT_Error af_cjk_hints_detect_features(AF_GlyphHints hints,AF_Dimension dim)

{
  AF_Segment *ppAVar1;
  AF_Edge *ppAVar2;
  AF_Edge *ppAVar3;
  char cVar4;
  byte bVar5;
  short sVar6;
  undefined2 uVar7;
  short sVar8;
  AF_Direction AVar9;
  AF_Segment pAVar10;
  FT_Memory memory;
  AF_StyleMetrics_conflict pAVar11;
  AF_Edge *ppAVar12;
  int iVar13;
  uint uVar14;
  AF_AxisHints axis_00;
  FT_Long FVar15;
  long lVar16;
  AF_Segment pAVar17;
  int iVar18;
  AF_Point_conflict pAVar19;
  long lVar20;
  AF_Edge_conflict pAVar21;
  uint uVar22;
  AF_Segment_conflict seg;
  AF_Segment pAVar23;
  AF_Segment pAVar24;
  AF_Segment_conflict pAVar25;
  ushort uVar26;
  AF_Edge_conflict pAVar27;
  ulong uVar28;
  AF_Edge_conflict pAVar29;
  int iVar30;
  long lVar31;
  ushort uVar32;
  long lVar33;
  long lVar35;
  int iVar36;
  ulong uVar37;
  AF_Segment pAVar38;
  AF_Segment_conflict pAVar39;
  AF_Segment pAVar40;
  bool bVar41;
  AF_AxisHints axis;
  AF_Edge_conflict local_68;
  AF_Edge_conflict local_38;
  ulong uVar34;
  
  uVar37 = (ulong)dim;
  pAVar39 = hints->axis[uVar37].segments;
  iVar18 = hints->axis[uVar37].num_segments;
  iVar13 = af_latin_hints_compute_segments(hints,dim);
  if ((iVar13 == 0) && (iVar13 = 0, 0 < iVar18)) {
    pAVar25 = pAVar39 + iVar18;
    do {
      pAVar19 = pAVar39->first;
      uVar26 = pAVar19->flags;
      pAVar39->flags = pAVar39->flags & 0xfe;
      if (pAVar19 != pAVar39->last) {
        uVar26 = uVar26 & 3;
        do {
          pAVar19 = pAVar19->next;
          uVar32 = pAVar19->flags & 3;
          if (uVar26 == 0 && uVar32 == 0) goto LAB_001830bf;
          uVar26 = uVar32;
        } while (pAVar19 != pAVar39->last);
        pAVar39->flags = pAVar39->flags | 1;
      }
LAB_001830bf:
      pAVar39 = pAVar39 + 1;
    } while (pAVar39 < pAVar25);
    iVar13 = 0;
  }
  if (iVar13 == 0) {
    axis_00 = hints->axis + uVar37;
    pAVar39 = hints->axis[uVar37].segments;
    iVar18 = axis_00->num_segments;
    AVar9 = hints->axis[uVar37].major_dir;
    uVar22 = *(uint *)&hints->metrics[1].style_class;
    uVar28 = (ulong)(dim != AF_DIMENSION_HORZ) * 0x10;
    FVar15 = FT_DivFix(0xc0,*(FT_Long *)((long)hints->axis[0].embedded.segments + (uVar28 - 0x68)));
    if (0 < (long)iVar18) {
      pAVar40 = pAVar39 + iVar18;
      lVar20 = 0;
      pAVar25 = pAVar39;
      do {
        cVar4 = pAVar25->dir;
        lVar16 = lVar20;
        pAVar17 = pAVar39;
        if (AVar9 == cVar4) {
          do {
            if (((lVar16 != 0) && ((int)pAVar17->dir + (int)cVar4 == 0)) &&
               (lVar31 = (long)pAVar17->pos - (long)pAVar25->pos, -1 < lVar31)) {
              uVar7 = pAVar25->max_coord;
              sVar6 = pAVar17->min_coord;
              if (pAVar17->min_coord < pAVar25->min_coord) {
                sVar6 = pAVar25->min_coord;
              }
              sVar8 = pAVar17->max_coord;
              if ((short)uVar7 < sVar8) {
                sVar8 = uVar7;
              }
              lVar33 = (long)sVar8 - (long)sVar6;
              if ((long)(ulong)(uVar22 >> 8) <= lVar33) {
                lVar35 = lVar31 * 8;
                if ((lVar35 < pAVar25->score * 9) &&
                   ((lVar35 < pAVar25->score * 7 || (pAVar25->len < lVar33)))) {
                  pAVar25->score = lVar31;
                  pAVar25->len = lVar33;
                  pAVar25->link = pAVar17;
                }
                if ((lVar35 < pAVar17->score * 9) &&
                   ((lVar35 < pAVar17->score * 7 || (pAVar17->len < lVar33)))) {
                  pAVar17->score = lVar31;
                  pAVar17->len = lVar33;
                  pAVar17->link = pAVar25;
                }
              }
            }
            pAVar17 = pAVar17 + 1;
            lVar16 = lVar16 + -0x50;
          } while (pAVar17 < pAVar40);
        }
        pAVar25 = pAVar25 + 1;
        lVar20 = lVar20 + 0x50;
      } while (pAVar25 < pAVar40);
      pAVar17 = pAVar39;
      if (0 < iVar18) {
        do {
          pAVar10 = pAVar17->link;
          if ((pAVar10 != (AF_Segment)0x0) && (pAVar10->link == pAVar17)) {
            sVar6 = pAVar10->pos;
            sVar8 = pAVar17->pos;
            if ((sVar8 < sVar6) && (lVar20 = pAVar17->score, lVar20 < FVar15)) {
              pAVar25 = pAVar39;
              do {
                if (((((pAVar17 != pAVar25 && pAVar25->pos <= sVar8) &&
                      (pAVar38 = pAVar25->link, pAVar38 != (AF_Segment)0x0)) &&
                     (pAVar38->link == pAVar25)) && (sVar6 <= pAVar38->pos)) &&
                   (((sVar8 != pAVar25->pos || (sVar6 != pAVar38->pos)) &&
                    ((lVar16 = pAVar25->score, lVar20 < lVar16 &&
                     (lVar20 * 4 - lVar16 != 0 && lVar16 <= lVar20 * 4)))))) {
                  pAVar23 = pAVar39;
                  if (SBORROW8(pAVar17->len,pAVar25->len * 3) !=
                      pAVar17->len + pAVar25->len * -3 < 0) {
                    pAVar10->link = (AF_Segment)0x0;
                    pAVar17->link = (AF_Segment)0x0;
                    break;
                  }
                  do {
                    pAVar24 = pAVar10;
                    if ((pAVar23->link == pAVar25) || (pAVar24 = pAVar17, pAVar23->link == pAVar38))
                    {
                      pAVar23->link = (AF_Segment)0x0;
                      pAVar23->serif = pAVar24;
                    }
                    pAVar23 = pAVar23 + 1;
                  } while (pAVar23 < pAVar40);
                }
                pAVar25 = pAVar25 + 1;
              } while (pAVar25 < pAVar40);
            }
          }
          pAVar17 = pAVar17 + 1;
        } while (pAVar17 < pAVar40);
        if (0 < iVar18) {
          do {
            pAVar17 = pAVar39->link;
            if ((pAVar17 != (AF_Segment)0x0) && (pAVar39 != pAVar17->link)) {
              pAVar39->link = (AF_Segment)0x0;
              if ((pAVar17->score < FVar15) || (pAVar39->score < pAVar17->score * 4)) {
                pAVar39->serif = pAVar17->link;
              }
            }
            pAVar39 = pAVar39 + 1;
          } while (pAVar39 < pAVar40);
        }
      }
    }
    memory = hints->memory;
    pAVar11 = hints->metrics;
    pAVar39 = hints->axis[uVar37].segments;
    iVar18 = axis_00->num_segments;
    hints->axis[uVar37].num_edges = 0;
    FVar15 = *(FT_Long *)((long)hints->axis[0].embedded.segments + ((uVar28 | 8) - 0x70));
    lVar20 = *(long *)((long)pAVar11 + uVar37 * 0x3838 + 0x1e8);
    lVar31 = (long)(int)FVar15;
    lVar16 = (int)lVar20 * lVar31;
    if (0x10 < (int)((ulong)(lVar16 + (lVar16 >> 0x3f) + 0x8000) >> 0x10)) {
      lVar20 = FT_DivFix(0x10,FVar15);
    }
    if (iVar18 < 1) {
      iVar13 = 0;
    }
    else {
      pAVar25 = pAVar39 + iVar18;
      iVar13 = 0;
      do {
        lVar16 = (long)hints->axis[uVar37].num_edges;
        if (lVar16 < 1) {
          local_68 = (AF_Edge_conflict)0x0;
        }
        else {
          pAVar29 = hints->axis[uVar37].edges;
          uVar28 = 0xffff;
          lVar33 = 0;
          local_68 = (AF_Edge_conflict)0x0;
          do {
            if (pAVar29[lVar33].dir == pAVar39->dir) {
              pAVar27 = pAVar29 + lVar33;
              iVar18 = (int)pAVar39->pos - (int)pAVar27->fpos;
              uVar26 = (ushort)iVar18;
              uVar32 = -uVar26;
              if (0 < iVar18) {
                uVar32 = uVar26;
              }
              uVar34 = (ulong)uVar32;
              if (uVar34 < uVar28 && (long)uVar34 < lVar20) {
                if (pAVar39->link != (AF_Segment)0x0) {
                  lVar35 = 0;
                  pAVar40 = pAVar27->first;
                  do {
                    if (pAVar40->link == (AF_Segment)0x0) {
                      bVar41 = true;
                    }
                    else {
                      sVar6 = pAVar39->link->pos;
                      sVar8 = pAVar40->link->pos;
                      iVar18 = (int)sVar8 - (int)sVar6;
                      if (sVar8 < sVar6) {
                        iVar18 = (int)sVar6 - (int)sVar8;
                      }
                      lVar35 = (long)iVar18;
                      bVar41 = lVar35 < lVar20;
                    }
                  } while ((bVar41) && (pAVar40 = pAVar40->edge_next, pAVar40 != pAVar27->first));
                  if (lVar20 <= lVar35) goto LAB_001834f9;
                }
                uVar28 = uVar34;
                local_68 = pAVar27;
              }
            }
LAB_001834f9:
            lVar33 = lVar33 + 1;
          } while (lVar33 != lVar16);
        }
        if (local_68 == (AF_Edge_conflict)0x0) {
          iVar13 = af_axis_hints_new_edge
                             (axis_00,(int)pAVar39->pos,(int)pAVar39->dir,'\0',memory,&local_38);
          bVar41 = iVar13 == 0;
          if (bVar41) {
            *(undefined8 *)&local_38->score = 0;
            local_38->first = (AF_Segment)0x0;
            local_38->link = (AF_Edge)0x0;
            local_38->serif = (AF_Edge)0x0;
            local_38->scale = 0;
            local_38->blue_edge = (AF_Width)0x0;
            local_38->pos = 0;
            local_38->flags = '\0';
            local_38->dir = '\0';
            *(undefined6 *)&local_38->field_0x1a = 0;
            *(undefined8 *)local_38 = 0;
            local_38->opos = 0;
            local_38->first = pAVar39;
            local_38->last = pAVar39;
            local_38->dir = pAVar39->dir;
            sVar6 = pAVar39->pos;
            local_38->fpos = sVar6;
            lVar16 = sVar6 * lVar31;
            lVar16 = lVar16 + (lVar16 >> 0x3f) + 0x8000 >> 0x10;
            local_38->opos = lVar16;
            local_38->pos = lVar16;
            pAVar39->edge_next = pAVar39;
          }
        }
        else {
          pAVar39->edge_next = local_68->first;
          local_68->last->edge_next = pAVar39;
          local_68->last = pAVar39;
          bVar41 = true;
        }
        if (!bVar41) {
          return iVar13;
        }
        pAVar39 = pAVar39 + 1;
      } while (pAVar39 < pAVar25);
    }
    iVar18 = hints->axis[uVar37].num_edges;
    if (0 < (long)iVar18) {
      pAVar29 = hints->axis[uVar37].edges;
      pAVar21 = pAVar29 + iVar18;
      pAVar27 = pAVar29;
      do {
        pAVar40 = pAVar27->first;
        pAVar17 = pAVar40;
        if (pAVar40 != (AF_Segment)0x0) {
          do {
            pAVar17->edge = pAVar27;
            ppAVar1 = &pAVar17->edge_next;
            pAVar17 = *ppAVar1;
          } while (*ppAVar1 != pAVar40);
        }
        pAVar27 = pAVar27 + 1;
      } while (pAVar27 < pAVar21);
      if (0 < iVar18) {
        do {
          pAVar40 = pAVar29->first;
          ppAVar2 = &pAVar29->link;
          ppAVar3 = &pAVar29->serif;
          iVar18 = 0;
          iVar30 = 0;
          pAVar17 = pAVar40;
          do {
            pAVar10 = pAVar17->serif;
            if (pAVar10 == (AF_Segment)0x0) {
              bVar41 = false;
            }
            else {
              bVar41 = pAVar10->edge != pAVar29;
            }
            bVar5 = pAVar17->flags;
            if ((pAVar17->link != (AF_Segment)0x0) || (bVar41)) {
              pAVar38 = pAVar17->link;
              ppAVar12 = ppAVar2;
              if (bVar41) {
                pAVar38 = pAVar10;
                ppAVar12 = ppAVar3;
              }
              pAVar27 = *ppAVar12;
              if (pAVar27 == (AF_Edge_conflict)0x0) {
LAB_001836d1:
                pAVar27 = pAVar38->edge;
              }
              else {
                uVar14 = (int)pAVar29->fpos - (int)pAVar27->fpos;
                uVar22 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar22 = uVar14;
                }
                sVar6 = pAVar17->pos;
                sVar8 = pAVar38->pos;
                iVar36 = (int)sVar8 - (int)sVar6;
                if (sVar8 < sVar6) {
                  iVar36 = (int)sVar6 - (int)sVar8;
                }
                if ((long)iVar36 < (long)((ulong)uVar22 & 0xffff)) goto LAB_001836d1;
              }
              if (bVar41) {
                *ppAVar3 = pAVar27;
                pAVar27->flags = pAVar27->flags | 2;
              }
              else {
                *ppAVar2 = pAVar27;
              }
            }
            uVar22 = bVar5 & 1;
            iVar18 = iVar18 + uVar22;
            iVar30 = iVar30 + (uint)(byte)((byte)uVar22 ^ 1);
            pAVar17 = pAVar17->edge_next;
          } while (pAVar17 != pAVar40);
          pAVar29->flags = iVar30 <= iVar18 && 0 < iVar18;
          if ((pAVar29->serif != (AF_Edge)0x0) && (*ppAVar2 != (AF_Edge)0x0)) {
            *ppAVar3 = (AF_Edge)0x0;
          }
          pAVar29 = pAVar29 + 1;
        } while (pAVar29 < pAVar21);
      }
    }
  }
  return iVar13;
}

Assistant:

static FT_Error
  af_cjk_hints_detect_features( AF_GlyphHints  hints,
                                AF_Dimension   dim )
  {
    FT_Error  error;


    error = af_cjk_hints_compute_segments( hints, dim );
    if ( !error )
    {
      af_cjk_hints_link_segments( hints, dim );

      error = af_cjk_hints_compute_edges( hints, dim );
    }
    return error;
  }